

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

void __thiscall ZXing::Pdf417::Writer::Writer(Writer *this)

{
  Encoder *this_00;
  undefined4 *in_RDI;
  pointer in_stack_ffffffffffffffc8;
  unique_ptr<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_> *this_01;
  
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0xffffffff;
  this_01 = (unique_ptr<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_> *)
            (in_RDI + 2);
  std::unique_ptr<ZXing::Pdf417::Encoder,std::default_delete<ZXing::Pdf417::Encoder>>::
  unique_ptr<std::default_delete<ZXing::Pdf417::Encoder>,void>(this_01);
  this_00 = (Encoder *)operator_new(0x1c);
  Encoder::Encoder(this_00,false);
  std::unique_ptr<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>::reset
            (this_01,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Writer::Writer()
{
	_encoder.reset(new Encoder);
}